

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void slang::ast::SpecparamSymbol::fromSyntax
               (Scope *scope,SpecparamDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::SpecparamSymbol_*> *results)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  SpecparamDeclaratorSyntax *node;
  SourceLocation this;
  __extent_storage<18446744073709551615UL> _Var2;
  Scope *in_RDI;
  SpecparamSymbol *param;
  SourceLocation loc;
  SpecparamDeclaratorSyntax *decl;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *__range2;
  iterator_base<const_slang::syntax::SpecparamDeclaratorSyntax_*> *in_stack_ffffffffffffff48;
  Compilation *in_stack_ffffffffffffff50;
  SourceLocation this_00;
  SourceLocation in_stack_ffffffffffffff60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  SourceLocation in_stack_ffffffffffffff70;
  Scope *scope_00;
  Symbol *in_stack_ffffffffffffff80;
  pointer in_stack_ffffffffffffff88;
  
  slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *)0x1039450);
  slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *)0x103946d);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<const_slang::syntax::SpecparamDeclaratorSyntax_*>_>
                      ((self_type *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    node = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<const_slang::syntax::SpecparamDeclaratorSyntax_*>,_false>
           ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<const_slang::syntax::SpecparamDeclaratorSyntax_*>,_false>
                        *)0x10394a4);
    parsing::Token::location(&node->name);
    in_stack_ffffffffffffff50 = Scope::getCompilation(in_RDI);
    parsing::Token::valueText((Token *)in_stack_ffffffffffffff60);
    this = (SourceLocation)
           BumpAllocator::
           emplace<slang::ast::SpecparamSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation&>
                     ((BumpAllocator *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                      (SourceLocation *)in_stack_ffffffffffffff60);
    Symbol::setSyntax((Symbol *)this,&node->super_SyntaxNode);
    this_00 = this;
    not_null<slang::syntax::ImplicitTypeSyntax_*>::operator*
              ((not_null<slang::syntax::ImplicitTypeSyntax_*> *)0x1039529);
    ValueSymbol::setDeclaredType
              ((ValueSymbol *)in_stack_ffffffffffffff50,(DataTypeSyntax *)in_stack_ffffffffffffff48)
    ;
    in_stack_ffffffffffffff60 = this;
    in_stack_ffffffffffffff68 =
         (basic_string_view<char,_std::char_traits<char>_> *)
         not_null<slang::syntax::ExpressionSyntax_*>::operator*
                   ((not_null<slang::syntax::ExpressionSyntax_*> *)0x103954e);
    _Var2._M_extent_value = (size_t)parsing::Token::location(&node->equals);
    ValueSymbol::setInitializerSyntax
              ((ValueSymbol *)this_00,(ExpressionSyntax *)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff70 = this;
    scope_00 = in_RDI;
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               in_stack_ffffffffffffff60,
               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_00);
    syntax_00._M_extent._M_extent_value = _Var2._M_extent_value;
    syntax_00._M_ptr = in_stack_ffffffffffffff88;
    Symbol::setAttributes(in_stack_ffffffffffffff80,scope_00,syntax_00);
    SmallVectorBase<const_slang::ast::SpecparamSymbol_*>::push_back
              ((SmallVectorBase<const_slang::ast::SpecparamSymbol_*> *)in_stack_ffffffffffffff50,
               (SpecparamSymbol **)in_stack_ffffffffffffff48);
    if (node->value2 != (ExpressionSyntax *)0x0) {
      *(bool *)((long)this + 0x150) = true;
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<const_slang::syntax::SpecparamDeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<const_slang::syntax::SpecparamDeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<const_slang::syntax::SpecparamDeclaratorSyntax_*>,_false>
                *)in_stack_ffffffffffffff50);
  }
  return;
}

Assistant:

void SpecparamSymbol::fromSyntax(const Scope& scope, const SpecparamDeclarationSyntax& syntax,
                                 SmallVectorBase<const SpecparamSymbol*>& results) {
    for (auto decl : syntax.declarators) {
        auto loc = decl->name.location();
        auto param = scope.getCompilation().emplace<SpecparamSymbol>(decl->name.valueText(), loc);
        param->setSyntax(*decl);
        param->setDeclaredType(*syntax.type);
        param->setInitializerSyntax(*decl->value1, decl->equals.location());
        param->setAttributes(scope, syntax.attributes);
        results.push_back(param);

        if (decl->value2)
            param->isPathPulse = true;
    }
}